

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::ClearEncoderErrorCount(AmpIO *this,uint index)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  
  uVar1 = this->NumEncoders;
  if (index == 0x10) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      this->encErrorCount[uVar2] = 0;
    }
  }
  else {
    if (uVar1 <= index) {
      return false;
    }
    this->encErrorCount[index] = 0;
  }
  return true;
}

Assistant:

bool AmpIO::ClearEncoderErrorCount(unsigned int index)
{
    bool ret = true;
    if (index == MAX_CHANNELS) {
        // Clear all counters
        for (unsigned int i = 0; i < NumEncoders; i++)
            encErrorCount[i] = 0;
    }
    else if (index < NumEncoders) {
        encErrorCount[index] = 0;
    }
    else {
        ret = false;
    }
    return ret;
}